

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void vttidy(void)

{
  ttcolor(1);
  ttnowindow();
  ttmove(nrow + -1,0);
  tteeol();
  tttidy();
  ttflush();
  ttclose();
  return;
}

Assistant:

void
vttidy(void)
{
	ttcolor(CTEXT);
	ttnowindow();		/* No scroll window.	 */
	ttmove(nrow - 1, 0);	/* Echo line.		 */
	tteeol();
	tttidy();
	ttflush();
	ttclose();
}